

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall DecPOMDPDiscrete::CreateNewRewardModel(DecPOMDPDiscrete *this)

{
  bool bVar1;
  char *__s;
  RewardModelMappingSparse *this_00;
  allocator<char> *__a;
  void *pvVar2;
  MultiAgentDecisionProcessDiscrete *in_RDI;
  string *ja_str;
  string *s_str;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  long *in_stack_ffffffffffffff38;
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [38];
  undefined1 local_62;
  undefined1 local_61 [40];
  undefined1 local_39 [57];
  
  if ((((ulong)in_RDI[1].super_MultiAgentDecisionProcess._m_name._vptr_NamedDescribedEntity &
       0x100000000) != 0) &&
     (in_stack_ffffffffffffff38 =
           *(long **)&in_RDI[1].super_MultiAgentDecisionProcess._m_name._m_name,
     in_stack_ffffffffffffff38 != (long *)0x0)) {
    (**(code **)(*in_stack_ffffffffffffff38 + 0x18))();
  }
  bVar1 = MultiAgentDecisionProcessDiscrete::GetSparse(in_RDI);
  if (bVar1) {
    __s = (char *)operator_new(200);
    local_62 = 1;
    this_00 = (RewardModelMappingSparse *)
              (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x30))();
    __a = (allocator<char> *)
          (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x70))();
    s_str = (string *)local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__s,__a)
    ;
    ja_str = (string *)local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__s,__a)
    ;
    RewardModelMappingSparse::RewardModelMappingSparse(this_00,(size_t)__s,(size_t)__a,s_str,ja_str)
    ;
    local_62 = 0;
    *(char **)&in_RDI[1].super_MultiAgentDecisionProcess._m_name._m_name = __s;
    std::__cxx11::string::~string((string *)(local_61 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_61);
    std::__cxx11::string::~string((string *)(local_39 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_39);
  }
  else {
    pvVar2 = operator_new(0x80);
    (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x30))();
    (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x70))();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
               (allocator<char> *)in_stack_ffffffffffffff20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
               (allocator<char> *)in_stack_ffffffffffffff20);
    RewardModelMapping::RewardModelMapping
              ((RewardModelMapping *)in_RDI,(size_t)in_stack_ffffffffffffff38,
               (size_t)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20
              );
    *(void **)&in_RDI[1].super_MultiAgentDecisionProcess._m_name._m_name = pvVar2;
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  return;
}

Assistant:

void DecPOMDPDiscrete::CreateNewRewardModel()
{
    if(_m_initialized)
    delete(_m_p_rModel);

    if(GetSparse())
        _m_p_rModel = new RewardModelMappingSparse( GetNrStates(), GetNrJointActions());
    else
        _m_p_rModel = new RewardModelMapping( GetNrStates(), GetNrJointActions());
}